

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_strand_array.h
# Opt level: O1

Split * __thiscall
embree::sse2::HeuristicStrandSplit::find
          (Split *__return_storage_ptr__,HeuristicStrandSplit *this,range<unsigned_long> *set,
          size_t logBlockSize)

{
  undefined4 uVar1;
  undefined4 uVar2;
  PrimRef *pPVar3;
  Geometry *pGVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  long lVar11;
  byte bVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar20;
  undefined1 auVar21 [12];
  undefined1 auVar22 [16];
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar29;
  undefined1 auVar30 [12];
  vfloat4 a_1;
  float fVar33;
  float fVar34;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar35;
  float fVar36;
  vfloat4 a;
  undefined1 auVar37 [16];
  float fVar38;
  float fVar39;
  vfloat4 a0;
  vfloat4 a0_1;
  LinearSpace3fa space0;
  LinearSpace3fa space1;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined1 local_128 [8];
  undefined8 uStack_120;
  long local_110;
  undefined1 local_108 [8];
  undefined8 uStack_100;
  undefined1 local_f8 [8];
  undefined8 uStack_f0;
  undefined1 local_e8 [8];
  undefined8 uStack_e0;
  undefined1 local_d8 [8];
  undefined8 uStack_d0;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [16];
  undefined1 local_98 [8];
  float fStack_90;
  float fStack_8c;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  uVar13 = set->_begin;
  if (uVar13 < set->_end) {
    uVar17 = uVar13 << 5 | 0x1c;
    local_138 = 0;
    uStack_130 = 0x3f800000;
    uVar16 = 0xffffffffffffffff;
    do {
      pPVar3 = this->prims;
      uVar14 = CONCAT44(*(undefined4 *)((long)&(pPVar3->lower).field_0 + uVar17),
                        *(undefined4 *)((long)pPVar3 + (uVar17 - 0x10)));
      if (uVar14 < uVar16) {
        pGVar4 = (this->scene->geometries).items[*(uint *)((long)pPVar3 + (uVar17 - 0x10))].ptr;
        (*(pGVar4->super_RefCount)._vptr_RefCount[0x37])
                  (local_98,pGVar4,(ulong)*(uint *)((long)&(pPVar3->lower).field_0 + uVar17));
        fVar26 = (float)local_98._4_4_ * (float)local_98._4_4_;
        fVar27 = fStack_90 * fStack_90;
        fVar28 = fStack_8c * fStack_8c;
        fVar20 = fVar26 + (float)local_98._0_4_ * (float)local_98._0_4_ + fVar27;
        auVar24._0_8_ = CONCAT44(fVar26 + fVar26 + fVar28,fVar20);
        auVar24._8_4_ = fVar26 + fVar27 + fVar27;
        auVar24._12_4_ = fVar26 + fVar28 + fVar28;
        if (1e-18 < fVar20) {
          auVar23._8_4_ = auVar24._8_4_;
          auVar23._0_8_ = auVar24._0_8_;
          auVar23._12_4_ = auVar24._12_4_;
          auVar24 = rsqrtss(auVar23,auVar24);
          fVar26 = auVar24._0_4_;
          fVar20 = fVar26 * fVar26 * fVar20 * -0.5 * fVar26 + fVar26 * 1.5;
          local_138 = CONCAT44((float)local_98._4_4_ * fVar20,(float)local_98._0_4_ * fVar20);
          uStack_130 = CONCAT44(fStack_8c * fVar20,fStack_90 * fVar20);
          uVar16 = uVar14;
        }
      }
      uVar13 = uVar13 + 1;
      uVar17 = uVar17 + 0x20;
    } while (uVar13 < set->_end);
  }
  else {
    local_138 = 0;
    uStack_130 = 0x3f800000;
  }
  uVar13 = set->_begin;
  uStack_100 = uStack_130;
  local_108 = (undefined1  [8])local_138;
  if (uVar13 < set->_end) {
    uVar17 = uVar13 << 5 | 0x1c;
    local_128._0_4_ = 1.0;
    uVar16 = 0xffffffffffffffff;
    do {
      pPVar3 = this->prims;
      uVar1 = *(undefined4 *)((long)pPVar3 + (uVar17 - 0x10));
      uVar2 = *(undefined4 *)((long)&(pPVar3->lower).field_0 + uVar17);
      pGVar4 = (this->scene->geometries).items[*(uint *)((long)pPVar3 + (uVar17 - 0x10))].ptr;
      (*(pGVar4->super_RefCount)._vptr_RefCount[0x37])
                (local_98,pGVar4,(ulong)*(uint *)((long)&(pPVar3->lower).field_0 + uVar17));
      fVar20 = fStack_90 * fStack_90 +
               (float)local_98._4_4_ * (float)local_98._4_4_ +
               (float)local_98._0_4_ * (float)local_98._0_4_;
      if (fVar20 < 0.0) {
        fVar20 = sqrtf(fVar20);
      }
      else {
        fVar20 = SQRT(fVar20);
      }
      if ((fVar20 != 0.0) || (NAN(fVar20))) {
        uVar14 = CONCAT44(uVar2,uVar1);
        auVar18._4_4_ = fVar20;
        auVar18._0_4_ = fVar20;
        auVar18._8_4_ = fVar20;
        auVar18._12_4_ = fVar20;
        _local_98 = divps(_local_98,auVar18);
        fVar20 = ABS((float)uStack_130 * local_98._8_4_ +
                     local_138._4_4_ * local_98._4_4_ + (float)local_138 * local_98._0_4_);
        if ((fVar20 < (float)local_128._0_4_) ||
           (fVar20 == (float)local_128._0_4_ && uVar14 < uVar16)) {
          uVar16 = uVar14;
          _local_108 = _local_98;
          local_128._0_4_ = fVar20;
        }
      }
      uVar13 = uVar13 + 1;
      uVar17 = uVar17 + 0x20;
    } while (uVar13 < set->_end);
  }
  fVar26 = -local_138._4_4_;
  fVar20 = -(float)uStack_130;
  auVar21._8_4_ = 0xffffffff;
  auVar21._0_8_ = 0xffffffffffffffff;
  auVar30._8_4_ = 0xffffffff;
  auVar30._0_8_ = 0xffffffffffffffff;
  if (fVar26 * fVar26 + (float)uStack_130 * (float)uStack_130 + 0.0 <=
      (float)local_138 * (float)local_138 + fVar20 * fVar20 + 0.0) {
    auVar30 = SUB1612((undefined1  [16])0x0,0);
  }
  fVar27 = (float)((uint)(float)uStack_130 & auVar30._4_4_);
  fVar20 = (float)(~auVar30._0_4_ & (uint)fVar20);
  fVar29 = (float)(~auVar30._8_4_ & (uint)(float)local_138 | (uint)fVar26 & auVar30._8_4_);
  fVar26 = fVar27 * fVar27;
  fVar28 = fVar29 * fVar29;
  fVar35 = fVar26 + fVar20 * fVar20 + fVar28;
  fVar36 = fVar26 + fVar26 + 0.0;
  fVar28 = fVar26 + fVar28 + fVar28;
  fVar26 = fVar26 + 0.0 + 0.0;
  auVar37._4_4_ = fVar36;
  auVar37._0_4_ = fVar35;
  auVar37._8_4_ = fVar28;
  auVar37._12_4_ = fVar26;
  auVar6._4_4_ = fVar36;
  auVar6._0_4_ = fVar35;
  auVar6._8_4_ = fVar28;
  auVar6._12_4_ = fVar26;
  auVar24 = rsqrtss(auVar37,auVar6);
  fVar26 = auVar24._0_4_;
  fVar26 = fVar26 * 1.5 - fVar26 * fVar26 * fVar35 * 0.5 * fVar26;
  fVar20 = fVar26 * fVar20;
  fVar27 = fVar26 * fVar27;
  fVar29 = fVar26 * fVar29;
  fVar28 = fVar27 * (float)local_138 - local_138._4_4_ * fVar20;
  fVar35 = fVar29 * local_138._4_4_ - (float)uStack_130 * fVar27;
  fVar36 = fVar20 * (float)uStack_130 - (float)local_138 * fVar29;
  fVar34 = fVar26 * 0.0 * uStack_130._4_4_ - uStack_130._4_4_ * fVar26 * 0.0;
  fVar26 = fVar35 * fVar35;
  fVar33 = fVar36 * fVar36;
  fVar34 = fVar34 * fVar34;
  fVar38 = fVar33 + fVar26 + fVar28 * fVar28;
  fVar39 = fVar34 + fVar26 + fVar26;
  fVar33 = fVar33 + fVar26 + fVar33;
  fVar34 = fVar34 + fVar26 + fVar34;
  auVar31._4_4_ = fVar39;
  auVar31._0_4_ = fVar38;
  auVar31._8_4_ = fVar33;
  auVar31._12_4_ = fVar34;
  auVar8._4_4_ = fVar39;
  auVar8._0_4_ = fVar38;
  auVar8._8_4_ = fVar33;
  auVar8._12_4_ = fVar34;
  auVar24 = rsqrtss(auVar31,auVar8);
  fVar26 = auVar24._0_4_;
  fVar26 = fVar26 * 1.5 - fVar26 * fVar26 * fVar38 * 0.5 * fVar26;
  local_98._4_4_ = fVar26 * fVar35;
  local_98._0_4_ = fVar20;
  fStack_90 = (float)local_138;
  fStack_8c = 0.0;
  local_88._4_4_ = fVar26 * fVar36;
  local_88._0_4_ = fVar27;
  local_88._8_4_ = local_138._4_4_;
  local_88._12_4_ = 0;
  local_78._4_4_ = fVar26 * fVar28;
  local_78._0_4_ = fVar29;
  local_78._8_4_ = (float)uStack_130;
  local_78._12_4_ = 0;
  fVar26 = -(float)local_108._4_4_;
  fVar20 = -(float)uStack_100;
  if (fVar26 * fVar26 + (float)uStack_100 * (float)uStack_100 + 0.0 <=
      (float)local_108._0_4_ * (float)local_108._0_4_ + fVar20 * fVar20 + 0.0) {
    auVar21 = SUB1612((undefined1  [16])0x0,0);
  }
  fVar34 = (float)((uint)(float)uStack_100 & auVar21._4_4_);
  fVar20 = (float)(~auVar21._0_4_ & (uint)fVar20);
  fVar29 = (float)(~auVar21._8_4_ & local_108._0_4_ | (uint)fVar26 & auVar21._8_4_);
  fVar26 = fVar34 * fVar34;
  fVar27 = fVar29 * fVar29;
  fVar28 = fVar26 + fVar20 * fVar20 + fVar27;
  fVar35 = fVar26 + fVar26 + 0.0;
  fVar27 = fVar26 + fVar27 + fVar27;
  fVar26 = fVar26 + 0.0 + 0.0;
  auVar32._4_4_ = fVar35;
  auVar32._0_4_ = fVar28;
  auVar32._8_4_ = fVar27;
  auVar32._12_4_ = fVar26;
  auVar5._4_4_ = fVar35;
  auVar5._0_4_ = fVar28;
  auVar5._8_4_ = fVar27;
  auVar5._12_4_ = fVar26;
  auVar24 = rsqrtss(auVar32,auVar5);
  fVar26 = auVar24._0_4_;
  fVar27 = fVar26 * 1.5 - fVar26 * fVar26 * fVar28 * 0.5 * fVar26;
  fVar20 = fVar27 * fVar20;
  fVar34 = fVar27 * fVar34;
  fVar29 = fVar27 * fVar29;
  fVar26 = fVar34 * (float)local_108._0_4_ - (float)local_108._4_4_ * fVar20;
  fVar28 = fVar29 * (float)local_108._4_4_ - (float)uStack_100 * fVar34;
  fVar35 = fVar20 * (float)uStack_100 - (float)local_108._0_4_ * fVar29;
  fVar33 = fVar27 * 0.0 * uStack_100._4_4_ - uStack_100._4_4_ * fVar27 * 0.0;
  fVar27 = fVar28 * fVar28;
  fVar36 = fVar35 * fVar35;
  fVar33 = fVar33 * fVar33;
  fVar38 = fVar36 + fVar27 + fVar26 * fVar26;
  fVar39 = fVar33 + fVar27 + fVar27;
  fVar36 = fVar36 + fVar27 + fVar36;
  fVar33 = fVar33 + fVar27 + fVar33;
  auVar22._4_4_ = fVar39;
  auVar22._0_4_ = fVar38;
  auVar22._8_4_ = fVar36;
  auVar22._12_4_ = fVar33;
  auVar7._4_4_ = fVar39;
  auVar7._0_4_ = fVar38;
  auVar7._8_4_ = fVar36;
  auVar7._12_4_ = fVar33;
  auVar24 = rsqrtss(auVar22,auVar7);
  fVar27 = auVar24._0_4_;
  fVar27 = fVar27 * 1.5 - fVar27 * fVar27 * fVar38 * 0.5 * fVar27;
  local_68._4_4_ = fVar27 * fVar28;
  local_68._0_4_ = fVar20;
  local_68._8_4_ = local_108._0_4_;
  local_68._12_4_ = 0;
  local_58._4_4_ = fVar27 * fVar35;
  local_58._0_4_ = fVar34;
  local_58._8_4_ = local_108._4_4_;
  local_58._12_4_ = 0;
  local_48._4_4_ = fVar27 * fVar26;
  local_48._0_4_ = fVar29;
  local_48._8_4_ = (float)uStack_100;
  local_48._12_4_ = 0;
  uVar13 = set->_begin;
  if (uVar13 < set->_end) {
    uVar16 = uVar13 << 5 | 0x1c;
    local_110 = 0;
    lVar15 = 0;
    uStack_e0 = 0xff800000ff800000;
    local_e8 = (undefined1  [8])0xff800000ff800000;
    uStack_120 = 0xff800000ff800000;
    local_128 = (undefined1  [8])0xff800000ff800000;
    uStack_f0 = 0x7f8000007f800000;
    local_f8 = (undefined1  [8])0x7f8000007f800000;
    uStack_d0 = 0x7f8000007f800000;
    local_d8 = (undefined1  [8])0x7f8000007f800000;
    do {
      pPVar3 = this->prims;
      pGVar4 = (this->scene->geometries).items[*(uint *)((long)pPVar3 + (uVar16 - 0x10))].ptr;
      (*(pGVar4->super_RefCount)._vptr_RefCount[0x37])
                (&local_b8,pGVar4,(ulong)*(uint *)((long)&(pPVar3->lower).field_0 + uVar16));
      fVar20 = fStack_b4 * fStack_b4;
      fVar26 = fStack_b0 * fStack_b0;
      fVar27 = fStack_ac * fStack_ac;
      fVar28 = fVar20 + local_b8 * local_b8 + fVar26;
      auVar25._0_8_ = CONCAT44(fVar20 + fVar20 + fVar27,fVar28);
      auVar25._8_4_ = fVar20 + fVar26 + fVar26;
      auVar25._12_4_ = fVar20 + fVar27 + fVar27;
      auVar19._8_4_ = auVar25._8_4_;
      auVar19._0_8_ = auVar25._0_8_;
      auVar19._12_4_ = auVar25._12_4_;
      auVar24 = rsqrtss(auVar19,auVar25);
      fVar20 = auVar24._0_4_;
      fVar20 = fVar20 * fVar20 * fVar28 * -0.5 * fVar20 + fVar20 * 1.5;
      if (ABS((float)uStack_130 * fVar20 * fStack_b0 +
              local_138._4_4_ * fVar20 * fStack_b4 + (float)local_138 * fVar20 * local_b8) <=
          ABS(fVar20 * fStack_b0 * (float)uStack_100 +
              fVar20 * fStack_b4 * (float)local_108._4_4_ +
              fVar20 * local_b8 * (float)local_108._0_4_)) {
        lVar15 = lVar15 + 1;
        pGVar4 = (this->scene->geometries).items[*(uint *)((long)pPVar3 + (uVar16 - 0x10))].ptr;
        (*(pGVar4->super_RefCount)._vptr_RefCount[0x3a])
                  (&local_b8,pGVar4,local_68,
                   (ulong)*(uint *)((long)&(pPVar3->lower).field_0 + uVar16));
        auVar10._4_4_ = fStack_b4;
        auVar10._0_4_ = local_b8;
        auVar10._8_4_ = fStack_b0;
        auVar10._12_4_ = fStack_ac;
        _local_d8 = minps(_local_d8,auVar10);
        _local_128 = maxps(_local_128,local_a8);
      }
      else {
        local_110 = local_110 + 1;
        pGVar4 = (this->scene->geometries).items[*(uint *)((long)pPVar3 + (uVar16 - 0x10))].ptr;
        (*(pGVar4->super_RefCount)._vptr_RefCount[0x3a])
                  (&local_b8,pGVar4,local_98,
                   (ulong)*(uint *)((long)&(pPVar3->lower).field_0 + uVar16));
        auVar9._4_4_ = fStack_b4;
        auVar9._0_4_ = local_b8;
        auVar9._8_4_ = fStack_b0;
        auVar9._12_4_ = fStack_ac;
        _local_f8 = minps(_local_f8,auVar9);
        _local_e8 = maxps(_local_e8,local_a8);
      }
      uVar13 = uVar13 + 1;
      uVar16 = uVar16 + 0x20;
    } while (uVar13 < set->_end);
  }
  else {
    lVar15 = 0;
    uStack_d0 = 0x7f8000007f800000;
    local_d8 = (undefined1  [8])0x7f8000007f800000;
    uStack_f0 = 0x7f8000007f800000;
    local_f8 = (undefined1  [8])0x7f8000007f800000;
    uStack_120 = 0xff800000ff800000;
    local_128 = (undefined1  [8])0xff800000ff800000;
    uStack_e0 = 0xff800000ff800000;
    local_e8 = (undefined1  [8])0xff800000ff800000;
    local_110 = 0;
  }
  if (lVar15 == 0 || local_110 == 0) {
    fVar20 = INFINITY;
  }
  else {
    bVar12 = (byte)logBlockSize;
    lVar11 = 1L << (bVar12 & 0x3f);
    fVar20 = (float)((local_110 + lVar11) - 1U >> (bVar12 & 0x3f)) *
             ((((float)local_e8._4_4_ - (float)local_f8._4_4_) +
              ((float)uStack_e0 - (float)uStack_f0)) *
              ((float)local_e8._0_4_ - (float)local_f8._0_4_) +
             ((float)uStack_e0 - (float)uStack_f0) * ((float)local_e8._4_4_ - (float)local_f8._4_4_)
             ) + ((((float)local_128._4_4_ - (float)local_d8._4_4_) +
                  ((float)uStack_120 - (float)uStack_d0)) *
                  ((float)local_128._0_4_ - (float)local_d8._0_4_) +
                 ((float)uStack_120 - (float)uStack_d0) *
                 ((float)local_128._4_4_ - (float)local_d8._4_4_)) *
                 (float)((lVar11 + lVar15) - 1U >> (bVar12 & 0x3f));
  }
  __return_storage_ptr__->sah = fVar20;
  *(undefined8 *)&(__return_storage_ptr__->axis0).field_0 = local_138;
  *(undefined8 *)((long)&(__return_storage_ptr__->axis0).field_0 + 8) = uStack_130;
  *(undefined1 (*) [8])&(__return_storage_ptr__->axis1).field_0 = local_108;
  *(undefined8 *)((long)&(__return_storage_ptr__->axis1).field_0 + 8) = uStack_100;
  return __return_storage_ptr__;
}

Assistant:

const Split find(const range<size_t>& set, size_t logBlockSize)
      {
        Vec3fa axis0(0,0,1);
        uint64_t bestGeomPrimID = -1;

        /* curve with minimum ID determines first axis */
        for (size_t i=set.begin(); i<set.end(); i++)
        {
          const uint64_t geomprimID = prims[i].ID64();
          if (geomprimID >= bestGeomPrimID) continue;
          const Vec3fa axis = direction(prims[i]);
          if (sqr_length(axis) > 1E-18f) {
            axis0 = normalize(axis);
            bestGeomPrimID = geomprimID;
          }
        }
      
        /* find 2nd axis that is most misaligned with first axis and has minimum ID */
        float bestCos = 1.0f;
        Vec3fa axis1 = axis0;
        bestGeomPrimID = -1;
        for (size_t i=set.begin(); i<set.end(); i++) 
        {
          const uint64_t geomprimID = prims[i].ID64();
          Vec3fa axisi = direction(prims[i]);
          float leni = length(axisi);
          if (leni == 0.0f) continue;
          axisi /= leni;
          float cos = abs(dot(axisi,axis0));
          if ((cos == bestCos && (geomprimID < bestGeomPrimID)) || cos < bestCos) {
            bestCos = cos; axis1 = axisi;
            bestGeomPrimID = geomprimID;
          }
        }
      
        /* partition the two strands */
        size_t lnum = 0, rnum = 0;
        BBox3fa lbounds = empty, rbounds = empty;
        const LinearSpace3fa space0 = frame(axis0).transposed();
        const LinearSpace3fa space1 = frame(axis1).transposed();
        
        for (size_t i=set.begin(); i<set.end(); i++)
        {
          PrimRef& prim = prims[i];
          const Vec3fa axisi = normalize(direction(prim));
          const float cos0 = abs(dot(axisi,axis0));
          const float cos1 = abs(dot(axisi,axis1));
          
          if (cos0 > cos1) { lnum++; lbounds.extend(bounds(space0,prim)); }
          else             { rnum++; rbounds.extend(bounds(space1,prim)); }
        }
      
        /*! return an invalid split if we do not partition */
        if (lnum == 0 || rnum == 0) 
          return Split(inf,axis0,axis1);
      
        /*! calculate sah for the split */
        const size_t lblocks = (lnum+(1ull<<logBlockSize)-1ull) >> logBlockSize;
        const size_t rblocks = (rnum+(1ull<<logBlockSize)-1ull) >> logBlockSize;
        const float sah = madd(float(lblocks),halfArea(lbounds),float(rblocks)*halfArea(rbounds));
        return Split(sah,axis0,axis1);
      }